

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int ARKStepCreateAdjointStepper
              (void *arkode_mem,SUNAdjRhsFn adj_fe,SUNAdjRhsFn adj_fi,sunrealtype tf,N_Vector sf,
              SUNContext_conflict sunctx,SUNAdjointStepper *adj_stepper_ptr)

{
  int iVar1;
  void *pvVar2;
  undefined8 in_RCX;
  long in_RDX;
  sunrealtype *in_RSI;
  void *in_R8;
  undefined8 *in_R9;
  undefined8 in_XMM0_Qa;
  SUNStepper_conflict adj_stepper;
  SUNStepper_conflict fwd_stepper;
  SUNErrCode errcode;
  ARKodeARKStepMem step_mem_adj;
  ARKodeMem ark_mem_adj;
  void *arkode_mem_adj;
  long nst;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffff58;
  SUNAdjointCheckpointScheme in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  undefined8 *arkode_mem_00;
  ARKodeARKStepMem in_stack_ffffffffffffff70;
  ARKodeMem in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  sunrealtype in_stack_ffffffffffffff88;
  ARKodeButcherTable Bi;
  ARKRhsFn in_stack_ffffffffffffff90;
  ARKRhsFn in_stack_ffffffffffffff98;
  void *arkode_mem_01;
  ARKodeMem local_48;
  uint local_4;
  
  iVar1 = arkStep_AccessARKODEStepMem
                    (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58,(ARKodeARKStepMem *)0x12e335);
  if (iVar1 == 0) {
    iVar1 = arkStepCompatibleWithAdjointSolver
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                       (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                       (char *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if (iVar1 == 0) {
      if (in_RDX == 0) {
        if (in_RSI == (sunrealtype *)0x0) {
          arkProcessError(local_48,-0x16,0xe28,"ARKStepCreateAdjointStepper",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"adj_fe cannot be NULL.");
          local_4 = 0xffffffea;
        }
        else {
          iVar1 = N_VGetVectorID(in_RCX);
          if (iVar1 == 0xd) {
            local_4 = ARKodeGetNumSteps(in_stack_ffffffffffffff68,(long *)in_stack_ffffffffffffff60)
            ;
            if (local_4 == 0) {
              pvVar2 = ARKStepCreate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                     in_stack_ffffffffffffff88,
                                     (N_Vector)
                                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                     (SUNContext_conflict)in_stack_ffffffffffffff78);
              if (pvVar2 == (void *)0x0) {
                arkProcessError(local_48,-0x15,0xe44,"ARKStepCreateAdjointStepper",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                ,"ARKStepCreate returned NULL");
                local_4 = 0xffffffeb;
              }
              else {
                Bi = *(ARKodeButcherTable *)((long)pvVar2 + 0x88);
                Bi->d = in_RSI;
                *(undefined4 *)((long)pvVar2 + 0x410) = 1;
                arkode_mem_01 = pvVar2;
                local_4 = ARKodeSetFixedStep(in_stack_ffffffffffffff68,
                                             (sunrealtype)in_stack_ffffffffffffff60);
                if (local_4 == 0) {
                  local_4 = ARKStepSetTables(arkode_mem_01,(int)((ulong)pvVar2 >> 0x20),(int)pvVar2,
                                             Bi,(ARKodeButcherTable)
                                                CONCAT44(in_stack_ffffffffffffff84,
                                                         in_stack_ffffffffffffff80));
                  if (local_4 == 0) {
                    local_4 = ARKodeSetMaxNumSteps
                                        (in_stack_ffffffffffffff68,(long)in_stack_ffffffffffffff60);
                    if (local_4 == 0) {
                      local_4 = ARKodeSetAdjointCheckpointScheme
                                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
                      if (local_4 == 0) {
                        local_4 = ARKodeCreateSUNStepper
                                            (in_stack_ffffffffffffff68,
                                             (SUNStepper *)in_stack_ffffffffffffff60);
                        if (local_4 == 0) {
                          iVar1 = SUNStepper_SetReInitFn
                                            (in_stack_ffffffffffffff78,arkStep_SUNStepperReInit);
                          if (iVar1 == 0) {
                            local_4 = ARKodeCreateSUNStepper
                                                (in_stack_ffffffffffffff68,
                                                 (SUNStepper *)in_stack_ffffffffffffff60);
                            if (local_4 == 0) {
                              iVar1 = SUNStepper_SetReInitFn
                                                (in_stack_ffffffffffffff70,arkStep_SUNStepperReInit)
                              ;
                              if (iVar1 == 0) {
                                iVar1 = SUNStepper_SetDestroyFn
                                                  (in_stack_ffffffffffffff70,
                                                   arkSUNStepperSelfDestruct);
                                if (iVar1 == 0) {
                                  arkode_mem_00 = in_R9;
                                  iVar1 = SUNAdjointStepper_Create
                                                    (in_XMM0_Qa,in_stack_ffffffffffffff78,1,
                                                     in_stack_ffffffffffffff70,1,0xffffffffffffffff,
                                                     in_RCX,local_48->checkpoint_scheme);
                                  if (iVar1 == 0) {
                                    iVar1 = SUNAdjointStepper_SetUserData
                                                      (*in_R9,local_48->user_data);
                                    if (iVar1 == 0) {
                                      local_4 = ARKodeSetUserData(arkode_mem_00,in_R8);
                                      if (local_4 == 0) {
                                        local_4 = 0;
                                      }
                                      else {
                                        arkProcessError(local_48,(int)(ulong)local_4,0xebd,
                                                        "ARKStepCreateAdjointStepper",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                                  ,"ARKodeSetUserData failed");
                                      }
                                    }
                                    else {
                                      arkProcessError(local_48,-0x37,0xeb3,
                                                      "ARKStepCreateAdjointStepper",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                                  ,"SUNAdjointStepper_SetUserData failed");
                                      local_4 = 0xffffffc9;
                                    }
                                  }
                                  else {
                                    arkProcessError(local_48,-0x37,0xeaa,
                                                    "ARKStepCreateAdjointStepper",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                                  ,"SUNAdjointStepper_Create failed");
                                    local_4 = 0xffffffc9;
                                  }
                                }
                                else {
                                  arkProcessError(local_48,-0x33,0xe9e,"ARKStepCreateAdjointStepper"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                                  ,"SUNStepper_SetDestroyFn failed");
                                  local_4 = 0xffffffcd;
                                }
                              }
                              else {
                                arkProcessError(local_48,-0x33,0xe93,"ARKStepCreateAdjointStepper",
                                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                                ,"SUNStepper_SetReInitFn failed");
                                local_4 = 0xffffffcd;
                              }
                            }
                            else {
                              arkProcessError(local_48,(int)(ulong)local_4,0xe8a,
                                              "ARKStepCreateAdjointStepper",
                                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                              ,"ARKodeCreateSUNStepper failed");
                            }
                          }
                          else {
                            arkProcessError(local_48,-0x33,0xe81,"ARKStepCreateAdjointStepper",
                                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                            ,"SUNStepper_SetReInitFn failed");
                            local_4 = 0xffffffcd;
                          }
                        }
                        else {
                          arkProcessError(local_48,(int)(ulong)local_4,0xe78,
                                          "ARKStepCreateAdjointStepper",
                                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                          ,"ARKodeCreateSUNStepper failed");
                        }
                      }
                      else {
                        arkProcessError(local_48,(int)(ulong)local_4,0xe6d,
                                        "ARKStepCreateAdjointStepper",
                                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                        ,"ARKodeSetAdjointCheckpointScheme failed");
                      }
                    }
                    else {
                      arkProcessError(local_48,(int)(ulong)local_4,0xe64,
                                      "ARKStepCreateAdjointStepper",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                      ,"ARKodeSetMaxNumSteps failed");
                    }
                  }
                  else {
                    arkProcessError(local_48,(int)(ulong)local_4,0xe5c,"ARKStepCreateAdjointStepper"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                    ,"ARKStepSetTables failed");
                  }
                }
                else {
                  arkProcessError(local_48,(int)(ulong)local_4,0xe51,"ARKStepCreateAdjointStepper",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                                  ,"ARKodeSetFixedStep failed");
                }
              }
            }
            else {
              arkProcessError(local_48,(int)(ulong)local_4,0xe3b,"ARKStepCreateAdjointStepper",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"ARKodeGetNumSteps failed");
            }
          }
          else {
            arkProcessError(local_48,-0x16,0xe2f,"ARKStepCreateAdjointStepper",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"Incompatible vector type provided for adjoint calculation");
            local_4 = 0xffffffea;
          }
        }
      }
      else {
        arkProcessError(local_48,-0x16,0xe21,"ARKStepCreateAdjointStepper",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"Implicit methods are not yet supported by the adjoint stepper.");
        local_4 = 0xffffffea;
      }
    }
    else {
      arkProcessError(local_48,-0x16,0xe1a,"ARKStepCreateAdjointStepper",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                      ,"ark_mem provided is not compatible with adjoint calculation");
      local_4 = 0xffffffea;
    }
  }
  else {
    arkProcessError((ARKodeMem)0x0,-0x16,0xe12,"ARKStepCreateAdjointStepper",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"The ARKStep memory pointer is NULL");
    local_4 = 0xffffffea;
  }
  return local_4;
}

Assistant:

int ARKStepCreateAdjointStepper(void* arkode_mem, SUNAdjRhsFn adj_fe,
                                SUNAdjRhsFn adj_fi, sunrealtype tf, N_Vector sf,
                                SUNContext sunctx,
                                SUNAdjointStepper* adj_stepper_ptr)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval = arkStep_AccessARKODEStepMem(arkode_mem,
                                           "ARKStepCreateAdjointStepper",
                                           &ark_mem, &step_mem);
  if (retval)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The ARKStep memory pointer is NULL");
    return ARK_ILL_INPUT;
  }

  if (arkStepCompatibleWithAdjointSolver(ark_mem, step_mem, __LINE__, __func__,
                                         __FILE__))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "ark_mem provided is not compatible with adjoint calculation");
    return ARK_ILL_INPUT;
  }

  if (adj_fi)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Implicit methods are not yet supported by the adjoint stepper.");
    return ARK_ILL_INPUT;
  }

  if (!adj_fe)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "adj_fe cannot be NULL.");
    return ARK_ILL_INPUT;
  }

  if (N_VGetVectorID(sf) != SUNDIALS_NVEC_MANYVECTOR)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible vector type provided for adjoint calculation");
    return ARK_ILL_INPUT;
  }

  /**
    Create and configure the ARKStep stepper for the adjoint system
  */
  long nst = 0;
  retval   = ARKodeGetNumSteps(arkode_mem, &nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeGetNumSteps failed");
    return retval;
  }

  void* arkode_mem_adj = ARKStepCreate(arkStep_fe_Adj, NULL, tf, sf,
                                       ark_mem->sunctx);
  if (!arkode_mem_adj)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKStepCreate returned NULL");
    return ARK_MEM_NULL;
  }
  ARKodeMem ark_mem_adj         = (ARKodeMem)arkode_mem_adj;
  ARKodeARKStepMem step_mem_adj = (ARKodeARKStepMem)ark_mem_adj->step_mem;

  step_mem_adj->adj_fe    = adj_fe;
  ark_mem_adj->do_adjoint = SUNTRUE;

  retval = ARKodeSetFixedStep(arkode_mem_adj, -ark_mem->h);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetFixedStep failed");
    return retval;
  }

  /* TODO(CJB): when we add support for implicit methods, we should call ARKodeSetLinear here. */

  retval = ARKStepSetTables(arkode_mem_adj, step_mem->Be->q, step_mem->Be->p,
                            step_mem->Bi, step_mem->Be);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKStepSetTables failed");
    return retval;
  }

  retval = ARKodeSetMaxNumSteps(arkode_mem_adj, nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetMaxNumSteps failed");
    return retval;
  }

  retval = ARKodeSetAdjointCheckpointScheme(arkode_mem_adj,
                                            ark_mem->checkpoint_scheme);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetAdjointCheckpointScheme failed");
    return retval;
  }

  SUNErrCode errcode = SUN_SUCCESS;

  SUNStepper fwd_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem, &fwd_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(fwd_stepper, arkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  SUNStepper adj_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem_adj, &adj_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(adj_stepper, arkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  /* Setting this ensures that the ARKodeMem underneath the adj_stepper
     is destroyed with the SUNStepper_Destroy call. */
  errcode = SUNStepper_SetDestroyFn(adj_stepper, arkSUNStepperSelfDestruct);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetDestroyFn failed");
    return retval;
  }

  /* SUNAdjointStepper will own the SUNSteppers and destroy them */
  errcode = SUNAdjointStepper_Create(fwd_stepper, SUNTRUE, adj_stepper, SUNTRUE,
                                     nst - 1, tf, sf, ark_mem->checkpoint_scheme,
                                     sunctx, adj_stepper_ptr);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_Create failed");
    return retval;
  }

  errcode = SUNAdjointStepper_SetUserData(*adj_stepper_ptr, ark_mem->user_data);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_SetUserData failed");
    return retval;
  }

  /* We need access to the adjoint solver to access the parameter Jacobian inside of ARKStep's
     backwards integration of the the adjoint problem. */
  retval = ARKodeSetUserData(arkode_mem_adj, *adj_stepper_ptr);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetUserData failed");
    return retval;
  }

  return ARK_SUCCESS;
}